

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O0

void __thiscall CMU462::OSDText::~OSDText(OSDText *this)

{
  long in_RDI;
  vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_> *this_00;
  
  this_00 = *(vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_> **)(in_RDI + 0x20);
  if (this_00 != (vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_> *)0x0) {
    operator_delete(this_00);
  }
  if (*(void **)(in_RDI + 0x10) != (void *)0x0) {
    operator_delete(*(void **)(in_RDI + 0x10));
  }
  if (*(void **)(in_RDI + 0x28) != (void *)0x0) {
    operator_delete(*(void **)(in_RDI + 0x28));
  }
  std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::clear
            ((vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_> *)0x2a89c4);
  (*__glewDeleteProgram)(*(GLuint *)(in_RDI + 0x4c));
  std::vector<CMU462::OSDLine,_std::allocator<CMU462::OSDLine>_>::~vector(this_00);
  return;
}

Assistant:

OSDText::~OSDText() {

  delete ft;
  delete font;
  delete face;

  lines.clear();

  glDeleteProgram(program);
}